

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O2

bool __thiscall
PcodeGenerator::CanInline(PcodeGenerator *this,string *top_label,string *bottom_label)

{
  PcodeType PVar1;
  bool bVar2;
  __type _Var3;
  pointer pPVar4;
  pointer pPVar5;
  pointer pPVar6;
  pointer pPVar7;
  string num1;
  pointer local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = std::operator==(top_label,"main");
  if (bVar2) {
LAB_0013b60d:
    bVar2 = false;
  }
  else {
    pPVar7 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = (pointer)0x0;
    pPVar6 = (pointer)0x0;
    for (; pPVar7 != (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl
                     .super__Vector_impl_data._M_finish; pPVar7 = pPVar7 + 1) {
      PVar1 = pPVar7->m_op;
      std::__cxx11::string::string((string *)&local_50,(string *)&pPVar7->m_num1);
      _Var3 = std::operator==(&local_50,top_label);
      pPVar5 = pPVar6;
      if (_Var3) {
        pPVar5 = pPVar7;
      }
      _Var3 = std::operator==(&local_50,bottom_label);
      pPVar4 = local_68;
      if (_Var3) {
        pPVar4 = pPVar7;
      }
      if (PVar1 == LABEL) {
        local_68 = pPVar4;
        pPVar6 = pPVar5;
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    for (; pPVar6 != local_68; pPVar6 = pPVar6 + 1) {
      PVar1 = pPVar6->m_op;
      std::__cxx11::string::string((string *)&local_50,(string *)&pPVar6->m_num1);
      if ((ulong)PVar1 == 0xe) {
        bVar2 = std::operator!=(&local_50,"RA");
        if (!bVar2) goto LAB_0013b5ec;
LAB_0013b603:
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_0013b60d;
      }
      if (PVar1 == CALL) goto LAB_0013b603;
LAB_0013b5ec:
      if (*pcode_string[PVar1] == 'B') goto LAB_0013b603;
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool PcodeGenerator::CanInline(const string& top_label, const string& bottom_label) {
    if (top_label == "main")
        return false;
    vector<Pcode>::iterator iter_top;
    vector<Pcode>::iterator iter_bottom;
    auto iter = m_pcode_queue.begin();
    for (; iter != m_pcode_queue.end(); ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if (num1 == top_label && op == LABEL)
            iter_top = iter;
        if (num1 == bottom_label && op == LABEL)
            iter_bottom = iter;
    }
    for (auto iter = iter_top; iter != iter_bottom; ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if ((op == JUMP && num1 != "RA") || op == CALL || pcode_string[op][0] == 'B')
        //if ((op == JUMP && num1 != "RA") || op == CALL)
            return false;
    }
    return true;
}